

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MachineBlocker.cpp
# Opt level: O1

bool __thiscall ApprovalTests::MachineBlocker::isBlockingOnThisMachine(MachineBlocker *this)

{
  int iVar1;
  bool bVar2;
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28 [16];
  
  SystemUtils::getMachineName_abi_cxx11_();
  if (local_30 == (this->machineName)._M_string_length) {
    if (local_30 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_38,(this->machineName)._M_dataplus._M_p,local_30);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return this->block == bVar2;
}

Assistant:

bool MachineBlocker::isBlockingOnThisMachine() const
    {
        const auto isMachine = (SystemUtils::getMachineName() == machineName);
        return isMachine == block;
    }